

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

undefined8
writeCSVFile(string *envName,string *defaultFile,string *dumpDir,string *defaultDir,int index)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  undefined8 in_RDI;
  string *in_R8;
  int in_stack_000001dc;
  string *in_stack_000001e0;
  string *in_stack_000001e8;
  string *in_stack_000001f0;
  string *in_stack_000001f8;
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [80];
  
  std::__cxx11::string::string(local_50,in_RSI);
  std::__cxx11::string::string(local_70,in_RDX);
  std::__cxx11::string::string(local_a0,in_RCX);
  std::__cxx11::string::string(local_c0,in_R8);
  writeFile(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,
            in_stack_000001dc);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

ofstream writeCSVFile(string envName, string defaultFile,string dumpDir,string defaultDir, int index){
    return writeFile(envName, defaultFile, dumpDir, defaultDir, index);
}